

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsListVec2f
          (X3DImporter *this,int pAttrIdx,
          list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pValue)

{
  FIReader *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  pointer pfVar3;
  vector<float,_std::allocator<float>_> tlist;
  allocator local_59;
  _Vector_base<float,_std::allocator<float>_> local_58;
  string local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,(vector<float,_std::allocator<float>_> *)&local_58);
  if (((int)local_58._M_impl.super__Vector_impl_data._M_finish -
       (int)local_58._M_impl.super__Vector_impl_data._M_start & 4U) == 0) {
    for (pfVar3 = local_58._M_impl.super__Vector_impl_data._M_start;
        pfVar3 != local_58._M_impl.super__Vector_impl_data._M_finish; pfVar3 = pfVar3 + 2) {
      local_40._M_dataplus._M_p = *(pointer *)pfVar3;
      std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::push_back
                (pValue,(value_type *)&local_40);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_58);
    return;
  }
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  iVar2 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                    (pFVar1,pAttrIdx);
  std::__cxx11::string::string((string *)&local_40,(char *)CONCAT44(extraout_var,iVar2),&local_59);
  Throw_ConvertFail_Str2ArrF(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_58);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsListVec2f(const int pAttrIdx, std::list<aiVector2D>& pValue)
{
    std::vector<float> tlist;

	XML_ReadNode_GetAttrVal_AsArrF(pAttrIdx, tlist);// read as list
    if ( tlist.size() % 2 )
    {
        Throw_ConvertFail_Str2ArrF( mReader->getAttributeValue( pAttrIdx ) );
    }

	// copy data to array
	for(std::vector<float>::iterator it = tlist.begin(); it != tlist.end();)
	{
		aiVector2D tvec;

		tvec.x = *it++;
		tvec.y = *it++;
		pValue.push_back(tvec);
	}
}